

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_document_start_event_initialize
              (yaml_event_t *event,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int implicit)

{
  int iVar1;
  yaml_version_directive_t *__ptr;
  yaml_tag_directive_t *pyVar2;
  size_t sVar3;
  yaml_char_t *pyVar4;
  yaml_char_t *pyVar5;
  yaml_tag_directive_t *pyVar6;
  yaml_tag_directive_t *__ptr_00;
  yaml_tag_directive_t *local_78;
  yaml_tag_directive_t *local_70;
  yaml_tag_directive_t *local_68;
  int local_5c;
  yaml_mark_t mark;
  
  mark.index = 0;
  mark.line = 0;
  mark.column = 0;
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d0,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  if ((tag_directives_start != tag_directives_end) &&
     (tag_directives_start == (yaml_tag_directive_t *)0x0 ||
      tag_directives_end == (yaml_tag_directive_t *)0x0)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d2,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  local_5c = implicit;
  if (version_directive == (yaml_version_directive_t *)0x0) {
    __ptr = (yaml_version_directive_t *)0x0;
LAB_00103989:
    if (tag_directives_start == tag_directives_end) {
      pyVar2 = (yaml_tag_directive_t *)0x0;
      local_78 = (yaml_tag_directive_t *)0x0;
    }
    else {
      pyVar2 = (yaml_tag_directive_t *)malloc(0x100);
      local_78 = pyVar2;
      if (pyVar2 == (yaml_tag_directive_t *)0x0) goto LAB_00103a8f;
      local_70 = pyVar2 + 0x10;
      for (; tag_directives_start != tag_directives_end;
          tag_directives_start = tag_directives_start + 1) {
        pyVar4 = tag_directives_start->handle;
        local_68 = pyVar2;
        if (pyVar4 == (yaml_char_t *)0x0) {
          __assert_fail("tag_directive->handle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                        ,0x2e2,
                        "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                       );
        }
        pyVar5 = tag_directives_start->prefix;
        if (pyVar5 == (yaml_char_t *)0x0) {
          __assert_fail("tag_directive->prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                        ,0x2e3,
                        "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                       );
        }
        sVar3 = strlen((char *)pyVar4);
        iVar1 = yaml_check_utf8(pyVar4,sVar3);
        if (iVar1 == 0) {
LAB_00103a96:
          pyVar4 = (yaml_char_t *)0x0;
          pyVar5 = (yaml_char_t *)0x0;
          __ptr_00 = local_78;
          pyVar6 = local_68;
          goto LAB_00103aba;
        }
        sVar3 = strlen((char *)pyVar5);
        iVar1 = yaml_check_utf8(pyVar5,sVar3);
        if (iVar1 == 0) goto LAB_00103a96;
        pyVar4 = yaml_strdup(pyVar4);
        pyVar5 = yaml_strdup(pyVar5);
        __ptr_00 = local_78;
        pyVar6 = local_68;
        if (((pyVar4 == (yaml_char_t *)0x0) || (pyVar5 == (yaml_char_t *)0x0)) ||
           ((pyVar6 = pyVar2, pyVar2 == local_70 &&
            (iVar1 = yaml_stack_extend(&local_78,&local_68,&local_70), pyVar6 = local_68,
            __ptr_00 = local_78, iVar1 == 0)))) goto LAB_00103aba;
        pyVar2 = pyVar6 + 1;
        pyVar6->handle = pyVar4;
        pyVar6->prefix = pyVar5;
      }
    }
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    event->type = YAML_DOCUMENT_START_EVENT;
    (event->start_mark).index = mark.index;
    (event->start_mark).line = mark.line;
    (event->start_mark).column = mark.column;
    (event->end_mark).index = mark.index;
    (event->end_mark).line = mark.line;
    (event->end_mark).column = mark.column;
    (event->data).document_start.version_directive = __ptr;
    (event->data).document_start.tag_directives.start = local_78;
    (event->data).document_start.tag_directives.end = pyVar2;
    (event->data).document_start.implicit = local_5c;
    iVar1 = 1;
  }
  else {
    __ptr = (yaml_version_directive_t *)malloc(8);
    if (__ptr != (yaml_version_directive_t *)0x0) {
      *__ptr = *version_directive;
      goto LAB_00103989;
    }
    __ptr = (yaml_version_directive_t *)0x0;
LAB_00103a8f:
    pyVar4 = (yaml_char_t *)0x0;
    pyVar5 = (yaml_char_t *)0x0;
    __ptr_00 = (yaml_tag_directive_t *)0x0;
    pyVar6 = (yaml_tag_directive_t *)0x0;
LAB_00103aba:
    for (; free(__ptr), pyVar6 != __ptr_00; pyVar6 = pyVar6 + -1) {
      __ptr = (yaml_version_directive_t *)pyVar6[-1].prefix;
      free(pyVar6[-1].handle);
    }
    free(__ptr_00);
    free(pyVar4);
    free(pyVar5);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

YAML_DECLARE(int)
yaml_document_start_event_initialize(yaml_event_t *event,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };

    assert(event);          /* Non-NULL event object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_START_EVENT_INIT(*event, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            implicit, mark, mark);

    return 1;

error:
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}